

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O3

void __thiscall hwnet::TCPSocket::sendContext::sendContext(sendContext *this,Ptr *buff,size_t len)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  
  peVar2 = (buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->buff).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  p_Var1 = (buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->buff).super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar2 = (buff->super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  this->ptr = ((peVar2->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->ptr + peVar2->b;
  this->next = (sendContext *)0x0;
  if (len == 0) {
    len = peVar2->len;
  }
  this->len = len;
  return;
}

Assistant:

sendContext(const Buffer::Ptr &buff,size_t len = 0):buff(buff),ptr(buff->BuffPtr()),next(nullptr){
			if(len > 0) {
				this->len = len;
			} else {
				this->len = buff->Len();
			}
		}